

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

char * gotcha_strstr(char *searchIn,char *searchFor)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  
  if (*searchFor == '\0') {
    return (char *)0x0;
  }
  lVar3 = 0;
  pcVar4 = searchIn;
  do {
    if (searchIn[lVar3] == '\0') {
      return (char *)0x0;
    }
    if (searchIn[lVar3] == *searchFor) {
      lVar5 = 1;
      do {
        pcVar1 = searchFor + lVar5;
        if (*pcVar1 == '\0') {
          return searchFor + lVar3;
        }
        pcVar2 = pcVar4 + lVar5;
        if (*pcVar2 == '\0') {
          return (char *)0x0;
        }
        lVar5 = lVar5 + 1;
      } while (*pcVar1 == *pcVar2);
    }
    lVar3 = lVar3 + 1;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

char *gotcha_strstr(const char *searchIn, const char *searchFor)
{
   int i, j;
   if (!searchFor[0])
      return NULL;

   for (i = 0; searchIn[i]; i++) {
      if (searchIn[i] != searchFor[0])
         continue;
      for (j = 1; ; j++) {
         if (!searchFor[j])
            return (char*)(searchFor + i);
         if (!searchIn[i+j])
            return NULL;
         if (searchFor[j] != searchIn[i+j])
            break;
      }
   }
   return NULL;
}